

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CConstructSymbolTableVisitor.cpp
# Opt level: O2

void __thiscall
CConstructSymbolTableVisitor::Visit(CConstructSymbolTableVisitor *this,CProgram *stm)

{
  CClassList *pCVar1;
  CMainClass *pCVar2;
  SymbolTable *this_00;
  __shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2> _Stack_38;
  __shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2> local_28;
  
  pCVar1 = (stm->classList)._M_t.super___uniq_ptr_impl<CClassList,_std::default_delete<CClassList>_>
           ._M_t.super__Tuple_impl<0UL,_CClassList_*,_std::default_delete<CClassList>_>.
           super__Head_base<0UL,_CClassList_*,_false>._M_head_impl;
  if (pCVar1 != (CClassList *)0x0) {
    (*(code *)**(undefined8 **)&(pCVar1->super_IWrapper).super_PositionedNode)(pCVar1,this);
  }
  local_28._M_ptr = (element_type *)0x0;
  local_28._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2> *)
             (this->info).super___shared_ptr<FullInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr,&local_28)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
  pCVar2 = (stm->mainClass)._M_t.super___uniq_ptr_impl<CMainClass,_std::default_delete<CMainClass>_>
           ._M_t.super__Tuple_impl<0UL,_CMainClass_*,_std::default_delete<CMainClass>_>.
           super__Head_base<0UL,_CMainClass_*,_false>._M_head_impl;
  if (pCVar2 != (CMainClass *)0x0) {
    (*(code *)**(undefined8 **)&(pCVar2->super_IWrapper).super_PositionedNode)(pCVar2,this);
  }
  this_00 = (this->table).super___shared_ptr<SymbolTable,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&_Stack_38,
             (__shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2> *)
             (this->info).super___shared_ptr<FullInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  SymbolTable::AddClass(this_00,(shared_ptr<ClassInfo> *)&_Stack_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_38._M_refcount);
  return;
}

Assistant:

void CConstructSymbolTableVisitor::Visit( CProgram &stm )
{
//	std::cout << "program\n";
	if( stm.classList ) {
		stm.classList->Accept( *this );
	}

	info->iClass = nullptr;
	if( stm.mainClass ) {
		stm.mainClass->Accept( *this );
	}
	table->AddClass( info->iClass );
}